

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefFuncConst(TranslateToFuzzReader *this,Type type)

{
  Module *module;
  string_view func_00;
  bool bVar1;
  Shareability SVar2;
  BasicHeapType BVar3;
  size_type sVar4;
  pointer pFVar5;
  ulong uVar6;
  RefFunc *pRVar7;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_00;
  const_reference pvVar8;
  IString *pIVar9;
  uint uVar10;
  Name name;
  Nop *local_1f0;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_188;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_170;
  string_view local_168;
  string_view local_158;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_148;
  IString *local_140;
  Function *func;
  undefined1 local_130 [16];
  Nop *local_120;
  Expression *body;
  Entry local_f8;
  Entry local_e8;
  Type local_d8 [3];
  Type local_c0;
  Signature local_b8;
  TypeBuilder local_a8 [8];
  TypeBuilder builder;
  RefAs *local_98;
  Expression *ret;
  Type local_68;
  reference local_60;
  value_type *func_1;
  Index i;
  Index start;
  size_t local_48;
  char *local_40;
  Function *local_38;
  Function *target;
  HeapType HStack_28;
  Shareability share;
  HeapType heapType;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  heapType.id = (uintptr_t)this;
  this_local = (TranslateToFuzzReader *)type.id;
  HStack_28 = Type::getHeapType((Type *)&this_local);
  target._4_4_ = wasm::HeapType::getShared();
  bVar1 = HeapType::isBasic(&stack0xffffffffffffffd8);
  if (bVar1) {
    BVar3 = HeapType::getBasic(&stack0xffffffffffffffd8,Unshared);
    if (BVar3 != func) {
      __assert_fail("heapType.getBasic(Unshared) == HeapType::func",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xcff,"Expression *wasm::TranslateToFuzzReader::makeRefFuncConst(Type)");
    }
    if (((this->funcContext != (FunctionCreationContext *)0x0) &&
        (SVar2 = wasm::HeapType::getShared(), SVar2 == target._4_4_)) &&
       (bVar1 = oneIn(this,4), !bVar1)) {
      local_38 = this->funcContext->func;
      local_48 = (local_38->super_Importable).super_Named.name.super_IString.str._M_len;
      local_40 = (local_38->super_Importable).super_Named.name.super_IString.str._M_str;
      _i = (local_38->type).id;
      pRVar7 = Builder::makeRefFunc
                         (&this->builder,
                          (Name)(local_38->super_Importable).super_Named.name.super_IString.str,_i);
      return (Expression *)pRVar7;
    }
  }
  bVar1 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::empty((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   *)(this->wasm + 0x18));
  if (!bVar1) {
    sVar4 = std::
            vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ::size((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    *)(this->wasm + 0x18));
    func_1._0_4_ = upTo(this,(Index)sVar4);
    func_1._4_4_ = (Index)func_1;
    do {
      local_60 = std::
                 vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ::operator[]((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               *)(this->wasm + 0x18),(ulong)(Index)func_1);
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_60);
      Type::Type(&local_68,(HeapType)(pFVar5->type).id,NonNullable,Inexact);
      uVar6 = wasm::Type::isSubType(local_68,(Type)this_local);
      if ((uVar6 & 1) != 0) {
        pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           (local_60);
        func_00 = (pFVar5->super_Importable).super_Named.name.super_IString.str;
        pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           (local_60);
        pRVar7 = Builder::makeRefFunc(&this->builder,(Name)func_00,(HeapType)(pFVar5->type).id);
        return (Expression *)pRVar7;
      }
      uVar10 = (Index)func_1 + 1;
      sVar4 = std::
              vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ::size((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      *)(this->wasm + 0x18));
      func_1._0_4_ = (Index)((ulong)uVar10 % sVar4);
    } while ((Index)func_1 != func_1._4_4_);
  }
  bVar1 = Type::isNullable((Type *)&this_local);
  if (((bVar1) && (bVar1 = oneIn(this,2), bVar1)) ||
     ((bVar1 = Type::isNonNullable((Type *)&this_local), bVar1 &&
      ((bVar1 = oneIn(this,0x10), bVar1 && (this->funcContext != (FunctionCreationContext *)0x0)))))
     ) {
    BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::nofunc,target._4_4_);
    HeapType::HeapType((HeapType *)&builder,BVar3);
    local_98 = (RefAs *)Builder::makeRefNull(&this->builder,_builder);
    bVar1 = Type::isNullable((Type *)&this_local);
    if (!bVar1) {
      if (this->funcContext == (FunctionCreationContext *)0x0) {
        __assert_fail("funcContext",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xd1d,"Expression *wasm::TranslateToFuzzReader::makeRefFuncConst(Type)");
      }
      local_98 = Builder::makeRefAs(&this->builder,RefAsNonNull,(Expression *)local_98);
    }
    type_local.id = (uintptr_t)local_98;
  }
  else {
    bVar1 = HeapType::isBasic(&stack0xffffffffffffffd8);
    if (bVar1) {
      wasm::TypeBuilder::TypeBuilder(local_a8,1);
      Type::Type(&local_c0,none);
      Type::Type(local_d8,none);
      Signature::Signature(&local_b8,local_c0,local_d8[0]);
      local_e8 = TypeBuilder::operator[](local_a8,0);
      TypeBuilder::Entry::operator=(&local_e8,local_b8);
      local_f8 = TypeBuilder::operator[](local_a8,0);
      TypeBuilder::Entry::setShared(&local_f8,target._4_4_);
      wasm::TypeBuilder::build();
      this_00 = TypeBuilder::BuildResult::operator*((BuildResult *)&body);
      pvVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[](this_00,0);
      HStack_28.id = pvVar8->id;
      TypeBuilder::BuildResult::~BuildResult((BuildResult *)&body);
      wasm::TypeBuilder::~TypeBuilder(local_a8);
    }
    local_130 = wasm::HeapType::getSignature();
    func._4_4_ = 0;
    bVar1 = Type::operator==((Type *)(local_130 + 8),(BasicType *)((long)&func + 4));
    if (bVar1) {
      local_1f0 = Builder::makeNop(&this->builder);
    }
    else {
      local_1f0 = (Nop *)Builder::makeUnreachable(&this->builder);
    }
    local_120 = local_1f0;
    module = this->wasm;
    Name::Name((Name *)&local_168,"ref_func_target");
    local_158 = (string_view)Names::getValidFunctionName(module,(Name)local_168);
    local_170 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)HStack_28.id;
    local_188.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_188);
    name.super_IString.str._M_str = (char *)local_158._M_len;
    name.super_IString.str._M_len = (size_t)&local_148;
    Builder::makeFunction(name,(HeapType)local_158._M_str,local_170,(Expression *)&local_188);
    pIVar9 = (IString *)wasm::Module::addFunction((unique_ptr *)module);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_148);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_188);
    local_140 = pIVar9;
    type_local.id = (uintptr_t)Builder::makeRefFunc(&this->builder,(Name)pIVar9->str,HStack_28);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefFuncConst(Type type) {
  auto heapType = type.getHeapType();
  auto share = heapType.getShared();
  if (heapType.isBasic()) {
    assert(heapType.getBasic(Unshared) == HeapType::func);
    // With high probability, use the last created function if possible.
    // Otherwise, continue on to select some other function.
    if (funcContext && funcContext->func->type.getShared() == share &&
        !oneIn(4)) {
      auto* target = funcContext->func;
      return builder.makeRefFunc(target->name, target->type);
    }
  }
  // Look for a proper function starting from a random location, and loop from
  // there, wrapping around to 0.
  if (!wasm.functions.empty()) {
    Index start = upTo(wasm.functions.size());
    Index i = start;
    do {
      auto& func = wasm.functions[i];
      if (Type::isSubType(Type(func->type, NonNullable), type)) {
        return builder.makeRefFunc(func->name, func->type);
      }
      i = (i + 1) % wasm.functions.size();
    } while (i != start);
  }
  // We don't have a matching function. Create a null some of the time here,
  // but only rarely if the type is non-nullable (because in that case we'd need
  // to add a ref.as_non_null to validate, and the code will trap when we get
  // here).
  if ((type.isNullable() && oneIn(2)) ||
      (type.isNonNullable() && oneIn(16) && funcContext)) {
    Expression* ret = builder.makeRefNull(HeapTypes::nofunc.getBasic(share));
    if (!type.isNullable()) {
      assert(funcContext);
      ret = builder.makeRefAs(RefAsNonNull, ret);
    }
    return ret;
  }
  // As a final option, create a new function with the correct signature. If it
  // returns a value, write a trap as we do not want to create any more code
  // here (we might end up recursing). Note that a trap in the function lets us
  // execute more code then the ref.as_non_null path just before us, which traps
  // even if we never call the function.
  if (heapType.isBasic()) {
    // We need a specific signature type to create a function. Pick an arbitrary
    // signature if we only had generic 'func' here.
    TypeBuilder builder(1);
    builder[0] = Signature(Type::none, Type::none);
    builder[0].setShared(share);
    heapType = (*builder.build())[0];
  }
  auto* body = heapType.getSignature().results == Type::none
                 ? (Expression*)builder.makeNop()
                 : (Expression*)builder.makeUnreachable();
  auto* func = wasm.addFunction(builder.makeFunction(
    Names::getValidFunctionName(wasm, "ref_func_target"), heapType, {}, body));
  return builder.makeRefFunc(func->name, heapType);
}